

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

Header * __thiscall Imf_3_4::ScanLineInputFile::header(ScanLineInputFile *this)

{
  element_type *peVar1;
  Header *in_RDI;
  lock_guard<std::mutex> lock;
  int in_stack_00000e84;
  Context *in_stack_00000e88;
  Header *in_stack_ffffffffffffff98;
  Header *pHVar2;
  Header *in_stack_ffffffffffffffb0;
  
  std::
  __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2267cc);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffff98);
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2267ee);
  if ((peVar1->header_filled & 1U) == 0) {
    std::
    __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x226806);
    Context::header(in_stack_00000e88,in_stack_00000e84);
    std::
    __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x226828);
    Header::operator=(in_RDI,in_stack_ffffffffffffff98);
    Header::~Header(in_stack_ffffffffffffffb0);
    peVar1 = std::
             __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x226853);
    peVar1->header_filled = true;
  }
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x226891);
  pHVar2 = &peVar1->header;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2268a3);
  return pHVar2;
}

Assistant:

const Header&
ScanLineInputFile::header () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    if (!_data->header_filled)
    {
        _data->header = _ctxt.header (_data->partNumber);
        _data->header_filled = true;
    }
    return _data->header;
}